

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool trans_SVC(DisasContext_conflict1 *s,arg_SVC *a)

{
  uint32_t semihost_imm;
  arg_SVC *a_local;
  DisasContext_conflict1 *s_local;
  
  arm_dc_feature(s,9);
  gen_set_pc_im(s,(s->base).pc_next);
  s->svc_imm = a->imm;
  (s->base).is_jmp = DISAS_TARGET_3;
  return true;
}

Assistant:

static bool trans_SVC(DisasContext *s, arg_SVC *a)
{
    const uint32_t semihost_imm = s->thumb ? 0xab : 0x123456;

    if (!arm_dc_feature(s, ARM_FEATURE_M) && false && // semihosting_enabled() &&
        !IS_USER(s) &&
        (a->imm == semihost_imm)) {
        gen_exception_internal_insn(s, s->pc_curr, EXCP_SEMIHOST);
    } else {
        gen_set_pc_im(s, s->base.pc_next);
        s->svc_imm = a->imm;
        s->base.is_jmp = DISAS_SWI;
    }
    return true;
}